

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# private_impl.cpp
# Opt level: O0

MMAL_COMPONENT_T * __thiscall
raspicam::_private::Private_Impl::create_camera_component(Private_Impl *this,RASPIVID_STATE *state)

{
  MMAL_FOURCC_T MVar1;
  MMAL_POOL_T *pMVar2;
  int *in_RSI;
  Private_Impl *in_RDI;
  MMAL_POOL_T *pool;
  MMAL_PARAMETER_CAMERA_CONFIG_T cam_config;
  MMAL_STATUS_T status;
  MMAL_PORT_T *video_port;
  MMAL_COMPONENT_T *camera;
  MMAL_PARAMETER_HEADER_T local_5c;
  int local_54;
  int local_50;
  undefined4 local_4c;
  undefined4 local_48;
  int local_44;
  int local_40;
  undefined4 local_3c;
  undefined4 local_38;
  undefined4 local_34;
  undefined4 local_30;
  MMAL_STATUS_T local_2c;
  MMAL_PORT_T *local_28;
  MMAL_COMPONENT_T *local_20;
  int *local_18;
  MMAL_COMPONENT_T *local_8;
  
  local_20 = (MMAL_COMPONENT_T *)0x0;
  local_28 = (MMAL_PORT_T *)0x0;
  local_18 = in_RSI;
  local_2c = mmal_component_create("vc.ril.camera",&local_20);
  if (local_2c == MMAL_SUCCESS) {
    if (local_20->output_num == 0) {
      std::operator<<((ostream *)&std::cerr,"Camera doesn\'t have output ports");
      mmal_component_destroy(local_20);
      local_8 = (MMAL_COMPONENT_T *)0x0;
    }
    else {
      local_28 = local_20->output[1];
      local_5c.id = 0x10015;
      local_5c.size = 0x30;
      local_54 = *local_18;
      local_50 = local_18[1];
      local_4c = 0;
      local_48 = 0;
      local_44 = *local_18;
      local_40 = local_18[1];
      local_3c = 3;
      local_38 = 0;
      local_34 = 0;
      local_30 = 2;
      mmal_port_parameter_set(local_20->control,&local_5c);
      in_RDI->format = local_28->format;
      MVar1 = convertFormat(in_RDI,(in_RDI->State).captureFtm);
      in_RDI->format->encoding_variant = MVar1;
      MVar1 = convertFormat(in_RDI,(in_RDI->State).captureFtm);
      in_RDI->format->encoding = MVar1;
      (in_RDI->format->es->audio).channels = *local_18 + 0x1fU & 0xffffffe0;
      (in_RDI->format->es->audio).sample_rate = local_18[1] + 0xfU & 0xfffffff0;
      (in_RDI->format->es->audio).bits_per_sample = 0;
      (in_RDI->format->es->audio).block_align = 0;
      (in_RDI->format->es->video).crop.width = *local_18;
      (in_RDI->format->es->video).crop.height = local_18[1];
      (in_RDI->format->es->video).frame_rate.num = local_18[2];
      (in_RDI->format->es->video).frame_rate.den = 1;
      local_2c = mmal_port_format_commit(local_28);
      if (local_2c == MMAL_SUCCESS) {
        local_2c = mmal_port_enable(local_28,video_buffer_callback);
        if (local_2c == MMAL_SUCCESS) {
          if (local_28->buffer_num < 3) {
            local_28->buffer_num = 3;
          }
          local_28->buffer_size = local_28->buffer_size_recommended;
          local_28->buffer_num = local_28->buffer_num_recommended;
          pMVar2 = mmal_port_pool_create(local_28,local_28->buffer_num,local_28->buffer_size);
          if (pMVar2 == (MMAL_POOL_T *)0x0) {
            std::operator<<((ostream *)&std::cerr,
                            "Failed to create buffer header pool for video output port");
          }
          *(MMAL_POOL_T **)(local_18 + 6) = pMVar2;
          local_2c = mmal_component_enable(local_20);
          if (local_2c == MMAL_SUCCESS) {
            *(MMAL_COMPONENT_T **)(local_18 + 4) = local_20;
            local_8 = local_20;
          }
          else {
            std::operator<<((ostream *)&std::cerr,"camera component couldn\'t be enabled");
            mmal_component_destroy(local_20);
            local_8 = (MMAL_COMPONENT_T *)0x0;
          }
        }
        else {
          std::operator<<((ostream *)&std::cerr,"camera video callback2 error");
          mmal_component_destroy(local_20);
          local_8 = (MMAL_COMPONENT_T *)0x0;
        }
      }
      else {
        std::operator<<((ostream *)&std::cerr,"camera video format couldn\'t be set");
        mmal_component_destroy(local_20);
        local_8 = (MMAL_COMPONENT_T *)0x0;
      }
    }
  }
  else {
    std::operator<<((ostream *)&std::cerr,"Failed to create camera component");
    local_8 = (MMAL_COMPONENT_T *)0x0;
  }
  return local_8;
}

Assistant:

MMAL_COMPONENT_T *Private_Impl::create_camera_component ( RASPIVID_STATE *state ) {
            MMAL_COMPONENT_T *camera = 0;
            MMAL_PORT_T  *video_port = NULL;

            MMAL_STATUS_T status;
            /* Create the component */
            status = mmal_component_create ( MMAL_COMPONENT_DEFAULT_CAMERA, &camera );

            if ( status != MMAL_SUCCESS ) {
                cerr<< ( "Failed to create camera component" );
                return 0;
            }

            if ( !camera->output_num ) {
                cerr<< ( "Camera doesn't have output ports" );
                mmal_component_destroy ( camera );
                return 0;
            }

            video_port = camera->output[MMAL_CAMERA_VIDEO_PORT];

            //  set up the camera configuration

            MMAL_PARAMETER_CAMERA_CONFIG_T cam_config;
            cam_config.hdr.id=MMAL_PARAMETER_CAMERA_CONFIG;
            cam_config.hdr.size=sizeof ( cam_config );
            cam_config.max_stills_w = state->width;
            cam_config.max_stills_h = state->height;
            cam_config.stills_yuv422 = 0;
            cam_config.one_shot_stills = 0;
            cam_config.max_preview_video_w = state->width;
            cam_config.max_preview_video_h = state->height;
            cam_config.num_preview_video_frames = 3;
            cam_config.stills_capture_circular_buffer_height = 0;
            cam_config.fast_preview_resume = 0;
            cam_config.use_stc_timestamp = MMAL_PARAM_TIMESTAMP_MODE_RESET_STC;
            mmal_port_parameter_set ( camera->control, &cam_config.hdr );

            // Set the encode format on the video  port

            format = video_port->format;
            format->encoding_variant =   convertFormat ( State.captureFtm );
            format->encoding = convertFormat ( State.captureFtm );
            format->es->video.width = VCOS_ALIGN_UP(state->width, 32);
            format->es->video.height = VCOS_ALIGN_UP(state->height, 16);
            format->es->video.crop.x = 0;
            format->es->video.crop.y = 0;
            format->es->video.crop.width = state->width;
            format->es->video.crop.height = state->height;
            format->es->video.frame_rate.num =  state->framerate;
            format->es->video.frame_rate.den = VIDEO_FRAME_RATE_DEN;

            status = mmal_port_format_commit ( video_port );
            if ( status ) {
                cerr<< ( "camera video format couldn't be set" );
                mmal_component_destroy ( camera );
                return 0;
            }

            // PR : plug the callback to the video port
            status = mmal_port_enable ( video_port,video_buffer_callback );
            if ( status ) {
                cerr<< ( "camera video callback2 error" );
                mmal_component_destroy ( camera );
                return 0;
            }

            // Ensure there are enough buffers to avoid dropping frames
            if ( video_port->buffer_num < VIDEO_OUTPUT_BUFFERS_NUM )
                video_port->buffer_num = VIDEO_OUTPUT_BUFFERS_NUM;



            //PR : create pool of message on video port
            MMAL_POOL_T *pool;
            video_port->buffer_size = video_port->buffer_size_recommended;
            video_port->buffer_num = video_port->buffer_num_recommended;
            pool = mmal_port_pool_create ( video_port, video_port->buffer_num, video_port->buffer_size );
            if ( !pool ) {
                cerr<< ( "Failed to create buffer header pool for video output port" );
            }
            state->video_pool = pool;


            /* Enable component */
            status = mmal_component_enable ( camera );

            if ( status ) {
                cerr<< ( "camera component couldn't be enabled" );
                mmal_component_destroy ( camera );
                return 0;
            }

            state->camera_component = camera;//this needs to be before set_all_parameters

            return camera;
        }